

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_scanCdataSection(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int local_34;
  int i;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 0xc) {
    enc_local._4_4_ = -1;
  }
  else {
    end_local = ptr;
    for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
      if ((*end_local != '\0') || (end_local[1] != "CDATA["[local_34])) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
    }
    *nextTokPtr = end_local;
    enc_local._4_4_ = 8;
  }
  return enc_local._4_4_;
}

Assistant:

static
int PREFIX(scanCdataSection)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  static const char CDATA_LSQB[] = { ASCII_C, ASCII_D, ASCII_A, ASCII_T, ASCII_A, ASCII_LSQB };
  int i;
  cmExpatUnused(enc);
  /* CDATA[ */
  if (end - ptr < 6 * MINBPC(enc))
    return XML_TOK_PARTIAL;
  for (i = 0; i < 6; i++, ptr += MINBPC(enc)) {
    if (!CHAR_MATCHES(enc, ptr, CDATA_LSQB[i])) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_CDATA_SECT_OPEN;
}